

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

int __thiscall
draco::PointCloud::AddAttribute
          (PointCloud *this,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_10;
  
  puVar1 = (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_10._M_head_impl =
       (pa->_M_t).
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t.
       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
       super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  (pa->_M_t).
  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl = (PointAttribute *)0x0;
  (*this->_vptr_PointCloud[2])(this,(ulong)((long)puVar1 - (long)puVar2) >> 3 & 0xffffffff);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             &local_10);
  return (int)((ulong)((long)(this->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->attributes_).
                            super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int PointCloud::AddAttribute(std::unique_ptr<PointAttribute> pa) {
  SetAttribute(static_cast<int>(attributes_.size()), std::move(pa));
  return static_cast<int>(attributes_.size() - 1);
}